

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFileDB.cpp
# Opt level: O1

void __thiscall ObjectFileDB::analyze_functions(ObjectFileDB *this)

{
  LinkedObjectFile *file;
  key_type *pkVar1;
  Function *pFVar2;
  long lVar3;
  long lVar4;
  Config *pCVar5;
  iterator iVar6;
  int64_t iVar7;
  char *__function;
  ulong uVar8;
  Function *pFVar9;
  key_type *pkVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  __hashtable *__h;
  Timer timer;
  vector<BasicBlock,_std::allocator<BasicBlock>_> local_80;
  Timer local_68;
  key_type *local_50;
  key_type *local_48;
  long local_40;
  long local_38;
  
  puts("- Analyzing Functions...");
  local_68._startTime.tv_sec = 0;
  local_68._startTime.tv_nsec = 0;
  Timer::start(&local_68);
  pCVar5 = get_config();
  if (pCVar5->find_basic_blocks == true) {
    Timer::start(&local_68);
    pkVar1 = (this->obj_file_order).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pkVar10 = (this->obj_file_order).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->obj_files_by_name)._M_h._M_element_count != (long)pkVar1 - (long)pkVar10 >> 5) {
      __function = 
      "void ObjectFileDB::for_each_obj(Func) [Func = (lambda at /workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/ObjectFileDB.h:77:18)]"
      ;
      goto LAB_001224e5;
    }
    uVar13 = 0;
    if (pkVar10 != pkVar1) {
      do {
        local_50 = pkVar1;
        local_48 = pkVar10;
        iVar6 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        *)this,pkVar10);
        if (iVar6.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>,_true>
            ._M_cur == (__node_type *)0x0) goto LAB_001224ad;
        lVar11 = *(long *)((long)iVar6.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>,_true>
                                 ._M_cur + 0x28);
        local_40 = *(long *)((long)iVar6.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>,_true>
                                   ._M_cur + 0x30);
        if (lVar11 != local_40) {
          do {
            if (0 < *(int *)(lVar11 + 0x70)) {
              file = (LinkedObjectFile *)(lVar11 + 0x18);
              uVar12 = 0;
              local_38 = lVar11;
              do {
                lVar11 = *(long *)(local_38 + 0xa8);
                uVar8 = (*(long *)(local_38 + 0xb0) - lVar11 >> 3) * -0x5555555555555555;
                if (uVar8 < uVar12 || uVar8 - uVar12 == 0) goto LAB_0012245a;
                pFVar2 = *(Function **)(lVar11 + 8 + uVar12 * 0x18);
                pFVar9 = *(Function **)(lVar11 + uVar12 * 0x18);
                lVar11 = local_38;
                for (; local_38 = lVar11, pFVar9 != pFVar2; pFVar9 = pFVar9 + 1) {
                  find_blocks_in_function(&local_80,file,(int)uVar12,pFVar9);
                  uVar8 = (long)local_80.super__Vector_base<BasicBlock,_std::allocator<BasicBlock>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_80.super__Vector_base<BasicBlock,_std::allocator<BasicBlock>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                  std::vector<BasicBlock,_std::allocator<BasicBlock>_>::operator=
                            (&pFVar9->basic_blocks,&local_80);
                  Function::analyze_prologue(pFVar9,file);
                  if (local_80.super__Vector_base<BasicBlock,_std::allocator<BasicBlock>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_80.
                                    super__Vector_base<BasicBlock,_std::allocator<BasicBlock>_>.
                                    _M_impl.super__Vector_impl_data._M_start,
                                    (long)local_80.
                                          super__Vector_base<BasicBlock,_std::allocator<BasicBlock>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_80.
                                          super__Vector_base<BasicBlock,_std::allocator<BasicBlock>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                  uVar13 = uVar13 + (int)(uVar8 >> 3);
                  lVar11 = local_38;
                }
                uVar12 = uVar12 + 1;
              } while ((long)uVar12 < (long)*(int *)(lVar11 + 0x70));
            }
            lVar11 = lVar11 + 0x120;
          } while (lVar11 != local_40);
        }
        pkVar10 = local_48 + 1;
        pkVar1 = local_50;
      } while (pkVar10 != local_50);
    }
    iVar7 = Timer::getNs(&local_68);
    printf("Found %d basic blocks in %.3f ms\n",SUB84((double)iVar7 / 1000000.0,0),(ulong)uVar13);
  }
  Timer::start(&local_68);
  pkVar1 = (this->obj_file_order).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pkVar10 = (this->obj_file_order).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->obj_files_by_name)._M_h._M_element_count == (long)pkVar1 - (long)pkVar10 >> 5) {
    while( true ) {
      if (pkVar10 == pkVar1) {
        return;
      }
      iVar6 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)this,pkVar10);
      if (iVar6.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>,_true>
          ._M_cur == (__node_type *)0x0) break;
      lVar3 = *(long *)((long)iVar6.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>,_true>
                              ._M_cur + 0x30);
      for (lVar11 = *(long *)((long)iVar6.
                                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>,_true>
                                    ._M_cur + 0x28); lVar11 != lVar3; lVar11 = lVar11 + 0x120) {
        if (*(int *)(lVar11 + 0x70) == 3) {
          lVar4 = *(long *)(lVar11 + 0xa8);
          if ((ulong)((*(long *)(lVar11 + 0xb0) - lVar4 >> 3) * -0x5555555555555555) < 3) {
            uVar12 = 2;
LAB_0012245a:
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar12);
          }
          pFVar9 = *(Function **)(lVar4 + 0x30);
          if (*(long *)(lVar4 + 0x38) - (long)pFVar9 != 0xd8) {
            __assert_fail("data.linked_data.functions_by_seg.at(2).size() == 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/ObjectFileDB.cpp"
                          ,0x19e,
                          "auto ObjectFileDB::analyze_functions()::(anonymous class)::operator()(ObjectFileData &) const"
                         );
          }
          if ((pFVar9->guessed_name)._M_string_length != 0) {
            __assert_fail("func.guessed_name.empty()",
                          "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/ObjectFileDB.cpp"
                          ,0x1a1,
                          "auto ObjectFileDB::analyze_functions()::(anonymous class)::operator()(ObjectFileData &) const"
                         );
          }
          std::__cxx11::string::_M_replace((ulong)&pFVar9->guessed_name,0,(char *)0x0,0x148274);
          Function::find_global_function_defs(pFVar9,(LinkedObjectFile *)(lVar11 + 0x18));
        }
      }
      pkVar10 = pkVar10 + 1;
    }
LAB_001224ad:
    std::__throw_out_of_range("_Map_base::at");
  }
  __function = 
  "void ObjectFileDB::for_each_obj(Func) [Func = (lambda at /workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/ObjectFileDB.cpp:411:18)]"
  ;
LAB_001224e5:
  __assert_fail("obj_files_by_name.size() == obj_file_order.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/ObjectFileDB.h"
                ,0x3e,__function);
}

Assistant:

void ObjectFileDB::analyze_functions() {
  printf("- Analyzing Functions...\n");
  Timer timer;

  if (get_config().find_basic_blocks) {
    timer.start();
    int total_basic_blocks = 0;
    for_each_function([&](Function& func, int segment_id, ObjectFileData& data) {
      auto blocks = find_blocks_in_function(data.linked_data, segment_id, func);
      total_basic_blocks += blocks.size();
      func.basic_blocks = blocks;
      func.analyze_prologue(data.linked_data);
    });

    printf("Found %d basic blocks in %.3f ms\n", total_basic_blocks, timer.getMs());
  }

  {
    timer.start();
    for_each_obj([&](ObjectFileData& data) {
      if(data.linked_data.segments == 3) {
        // the top level segment should have a single function
        assert(data.linked_data.functions_by_seg.at(2).size() == 1);

        auto& func = data.linked_data.functions_by_seg.at(2).front();
        assert(func.guessed_name.empty());
        func.guessed_name = "(top-level-init)";
        func.find_global_function_defs(data.linked_data);
      }
    });
  }
}